

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O1

void NULLC::AssignObject(NULLCRef l,NULLCRef r)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  undefined8 in_RAX;
  char *__function;
  uint in_stack_00000008;
  undefined4 in_stack_0000000c;
  
  if (in_stack_00000008 < *(uint *)(linker + 0x20c)) {
    lVar4 = *(long *)(linker + 0x200);
    puVar1 = (uint *)(lVar4 + (ulong)in_stack_00000008 * 0x50);
    if (*(uint *)(lVar4 + 0x24 + (ulong)in_stack_00000008 * 0x50) == l.ptr._4_4_) {
      memcpy((void *)CONCAT44(l.typeID,in_stack_0000000c),&stack0x0000001c,(ulong)puVar1[1]);
      return;
    }
    if (l.ptr._4_4_ < *(uint *)(linker + 0x20c)) {
      uVar2 = *(uint *)(lVar4 + (ulong)l.ptr._4_4_ * 0x50);
      if ((uVar2 < *(uint *)(linker + 0x29c)) &&
         (uVar3 = *puVar1, uVar3 < *(uint *)(linker + 0x29c))) {
        nullcThrowError("ERROR: can\'t assign value of type %s to a pointer of type %s",
                        (ulong)uVar2 + *(long *)(linker + 0x290),
                        (ulong)uVar3 + *(long *)(linker + 0x290),in_RAX);
        return;
      }
      __function = 
      "T &FastVector<char>::operator[](unsigned int) [T = char, zeroNewMemory = false, skipConstructor = false]"
      ;
      goto LAB_0011d4df;
    }
  }
  __function = 
  "T &FastVector<ExternTypeInfo>::operator[](unsigned int) [T = ExternTypeInfo, zeroNewMemory = false, skipConstructor = false]"
  ;
LAB_0011d4df:
  __assert_fail("index < count",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0x7f,__function);
}

Assistant:

void NULLC::AssignObject(NULLCRef l, NULLCRef r)
{
	if(linker->exTypes[l.typeID].subType != r.typeID)
	{
		nullcThrowError("ERROR: can't assign value of type %s to a pointer of type %s", &linker->exSymbols[linker->exTypes[r.typeID].offsetToName], &linker->exSymbols[linker->exTypes[l.typeID].offsetToName]);
		return;
	}
	memcpy(l.ptr, &r.ptr, linker->exTypes[l.typeID].size);
}